

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

iterator __thiscall
absl::lts_20240722::container_internal::
raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
::find<std::__cxx11::string>
          (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<google::protobuf::Descriptor_const*>,google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,std::allocator<google::protobuf::Descriptor_const*>>
           *this,key_arg<std::__cxx11::basic_string<char>_> *key)

{
  char *pcVar1;
  size_t sVar2;
  raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *prVar3;
  undefined8 *puVar4;
  uint uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  undefined8 uVar18;
  undefined1 *puVar19;
  ushort uVar20;
  int iVar21;
  size_t cap_3;
  MixingHashState MVar22;
  slot_type *ppDVar23;
  anon_union_8_1_a8a14541_for_iterator_2 aVar24;
  slot_type *in_RDX;
  slot_type *extraout_RDX;
  slot_type *extraout_RDX_00;
  slot_type *slot;
  slot_type *extraout_RDX_01;
  slot_type *extraout_RDX_02;
  ulong extraout_RDX_03;
  size_t extraout_RDX_04;
  size_t __n;
  slot_type *extraout_RDX_05;
  ulong uVar25;
  size_t cap_2;
  long lVar26;
  undefined1 (*pauVar27) [16];
  ulong i;
  uint uVar28;
  ulong uVar29;
  undefined1 uVar30;
  uint64_t v;
  ulong uVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  iterator iVar35;
  anon_class_24_3_2b146c49 assert_consistent;
  __m128i match;
  size_t hash_of_arg;
  char local_a8;
  char cStack_a7;
  char cStack_a6;
  char cStack_a5;
  char cStack_a4;
  char cStack_a3;
  char cStack_a2;
  char cStack_a1;
  anon_class_24_3_2b146c49 local_80;
  anon_class_24_3_2b146c49 local_68;
  undefined1 local_48 [16];
  slot_type *local_38;
  
  if (1 < *(ulong *)(this + 8)) {
    sVar2 = key->_M_string_length;
    MVar22 = hash_internal::MixingHashState::combine_contiguous
                       ((MixingHashState)&hash_internal::MixingHashState::kSeed,
                        (uchar *)(key->_M_dataplus)._M_p,sVar2);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = MVar22.state_ + sVar2;
    in_RDX = (slot_type *)
             (SUB168(auVar32 * ZEXT816(0x9ddfea08eb382d69),8) ^
             SUB168(auVar32 * ZEXT816(0x9ddfea08eb382d69),0));
    local_80.hash_of_arg = (size_t *)&local_38;
    prVar3 = *(raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
               **)this;
    local_80.key = key;
    local_80.this =
         (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
          *)this;
    local_38 = in_RDX;
    if (prVar3 == (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   *)0x1) {
      ppDVar23 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                             *)this);
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::
      AssertHashEqConsistent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::anon_class_24_3_2b146c49::operator()(&local_80,(ctrl_t *)ppDVar23,slot);
      in_RDX = extraout_RDX_01;
    }
    else {
      if (prVar3 == (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     *)0x0) goto LAB_001fadcd;
      if (prVar3 < (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                    *)0x11) {
        lVar26 = *(long *)(this + 0x18);
        raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
        ::slot_array(prVar3);
        local_68.hash_of_arg = local_80.hash_of_arg;
        local_68.key = local_80.key;
        local_68.this = local_80.this;
        uVar29 = *(ulong *)this;
        pauVar27 = *(undefined1 (**) [16])(this + 0x10);
        in_RDX = extraout_RDX;
        if (uVar29 < 0xf) {
          if (8 < uVar29) {
            __assert_fail("cap <= GroupPortableImpl::kWidth && \"unexpectedly large small capacity\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x753,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::Descriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                         );
          }
          uVar29 = *(ulong *)(*pauVar27 + uVar29) & 0x8080808080808080;
          if (uVar29 != 0x8080808080808080) {
            uVar29 = uVar29 ^ 0x8080808080808080;
            ppDVar23 = extraout_RDX;
            do {
              lVar6 = 0;
              if (uVar29 != 0) {
                for (; (uVar29 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                }
              }
              raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
              ::
              AssertHashEqConsistent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::anon_class_24_3_2b146c49::operator()
                        (&local_68,(ctrl_t *)((ulong)((uint)lVar6 & 0xfffffff8) + lVar26 + -8),
                         ppDVar23);
              uVar29 = uVar29 & uVar29 - 1;
              ppDVar23 = extraout_RDX_00;
              in_RDX = extraout_RDX_00;
            } while (uVar29 != 0);
          }
        }
        else if (1 < *(ulong *)(this + 8)) {
          uVar31 = *(ulong *)(this + 8) >> 1;
          uVar29 = uVar31;
          while( true ) {
            auVar32 = *pauVar27;
            uVar28 = (uint)(ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                                    (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                                   (ushort)(byte)(auVar32[0xf] >> 7) << 0xf);
            if (uVar28 != 0xffff) {
              uVar28 = ~uVar28;
              do {
                uVar5 = 0;
                if (uVar28 != 0) {
                  for (; (uVar28 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                  }
                }
                if ((char)(*pauVar27)[uVar5] < '\0') {
                  __assert_fail("IsFull(ctrl[i]) && \"hash table was modified unexpectedly\"",
                                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                                ,0x764,
                                "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::Descriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                               );
                }
                raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                ::
                AssertHashEqConsistent<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::anon_class_24_3_2b146c49::operator()
                          (&local_68,(ctrl_t *)(lVar26 + (ulong)uVar5 * 8),in_RDX);
                uVar29 = uVar29 - 1;
                uVar20 = (ushort)(uVar28 - 1) & (ushort)uVar28;
                uVar28 = CONCAT22((short)(uVar28 - 1 >> 0x10),uVar20);
                in_RDX = extraout_RDX_02;
              } while (uVar20 != 0);
            }
            if (uVar29 == 0) break;
            lVar26 = lVar26 + 0x80;
            puVar19 = *pauVar27;
            pauVar27 = pauVar27 + 1;
            if (puVar19[0xf] == -1) {
              __assert_fail("(remaining == 0 || *(ctrl - 1) != ctrl_t::kSentinel) && \"hash table was modified unexpectedly\""
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                            ,0x76b,
                            "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::Descriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                           );
            }
          }
          if (uVar31 < *(ulong *)(this + 8) >> 1) {
            __assert_fail("original_size_for_assert >= c.size() && \"hash table was modified unexpectedly\""
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                          ,0x770,
                          "void absl::container_internal::IterateOverFullSlots(const CommonFields &, SlotType *, Callback) [SlotType = const google::protobuf::Descriptor *, Callback = (lambda at /workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h:3842:36)]"
                         );
          }
        }
      }
    }
  }
  prVar3 = *(raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
             **)this;
  if (prVar3 == (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 *)0x1) {
    if (1 < *(ulong *)(this + 8)) {
      ppDVar23 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                             *)this);
      in_RDX = (slot_type *)key->_M_string_length;
      if (((slot_type *)(*ppDVar23)->all_names_->_M_string_length == in_RDX) &&
         ((in_RDX == (slot_type *)0x0 ||
          (iVar21 = bcmp(((*ppDVar23)->all_names_->_M_dataplus)._M_p,(key->_M_dataplus)._M_p,
                         (size_t)in_RDX), in_RDX = extraout_RDX_05, iVar21 == 0)))) {
        aVar24.slot_ = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                       ::soo_slot((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                   *)this);
        iVar35.field_1.slot_ = aVar24.slot_;
        iVar35.ctrl_ = (ctrl_t *)&kSooControl;
        return iVar35;
      }
    }
    auVar8._8_8_ = 0;
    auVar8._0_8_ = in_RDX;
    return (iterator)(auVar8 << 0x40);
  }
  if (prVar3 != (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 *)0x0) {
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ::prefetch_heap_block(prVar3);
    sVar2 = key->_M_string_length;
    MVar22 = hash_internal::MixingHashState::combine_contiguous
                       ((MixingHashState)&hash_internal::MixingHashState::kSeed,
                        (uchar *)(key->_M_dataplus)._M_p,sVar2);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = MVar22.state_ + sVar2;
    prVar3 = *(raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
               **)this;
    if (prVar3 == (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   *)0x1) {
      __assert_fail("!is_soo()",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xdb0,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, std::allocator<const google::protobuf::Descriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, Alloc = std::allocator<const google::protobuf::Descriptor *>, K = std::basic_string<char>]"
                   );
    }
    if (prVar3 != (raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                   *)0x0) {
      if (((ulong)((long)&(prVar3->settings_).
                          super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
                          .
                          super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>
                          .value.capacity_ + 1U) & (ulong)prVar3) != 0) {
        __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                      ,0x145,
                      "absl::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                     );
      }
      uVar31 = SUB168(auVar7 * ZEXT816(0x9ddfea08eb382d69),8) ^
               SUB168(auVar7 * ZEXT816(0x9ddfea08eb382d69),0);
      uVar29 = *(ulong *)(this + 0x10);
      uVar25 = uVar31 >> 7 ^ uVar29 >> 0xc;
      raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::control(prVar3);
      uVar30 = (undefined1)uVar31;
      auVar32 = ZEXT216(CONCAT11(uVar30,uVar30) & 0x7f7f);
      auVar32 = pshuflw(auVar32,auVar32,0);
      local_48._0_4_ = auVar32._0_4_;
      local_48._4_4_ = local_48._0_4_;
      local_48._8_4_ = local_48._0_4_;
      local_48._12_4_ = local_48._0_4_;
      uVar31 = 0;
      __n = extraout_RDX_03;
      while( true ) {
        uVar25 = uVar25 & (ulong)prVar3;
        pcVar1 = (char *)(uVar29 + uVar25);
        uVar18 = *(undefined8 *)pcVar1;
        cVar10 = pcVar1[8];
        cVar11 = pcVar1[9];
        cVar12 = pcVar1[10];
        cVar13 = pcVar1[0xb];
        cVar14 = pcVar1[0xc];
        cVar15 = pcVar1[0xd];
        cVar16 = pcVar1[0xe];
        cVar17 = pcVar1[0xf];
        auVar33[0] = -(local_48[0] == *pcVar1);
        auVar33[1] = -(local_48[1] == pcVar1[1]);
        auVar33[2] = -(local_48[2] == pcVar1[2]);
        auVar33[3] = -(local_48[3] == pcVar1[3]);
        auVar33[4] = -(local_48[4] == pcVar1[4]);
        auVar33[5] = -(local_48[5] == pcVar1[5]);
        auVar33[6] = -(local_48[6] == pcVar1[6]);
        auVar33[7] = -(local_48[7] == pcVar1[7]);
        auVar33[8] = -(local_48[8] == cVar10);
        auVar33[9] = -(local_48[9] == cVar11);
        auVar33[10] = -(local_48[10] == cVar12);
        auVar33[0xb] = -(local_48[0xb] == cVar13);
        auVar33[0xc] = -(local_48[0xc] == cVar14);
        auVar33[0xd] = -(local_48[0xd] == cVar15);
        auVar33[0xe] = -(local_48[0xe] == cVar16);
        auVar33[0xf] = -(local_48[0xf] == cVar17);
        uVar20 = (ushort)(SUB161(auVar33 >> 7,0) & 1) | (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe | (ushort)(auVar33[0xf] >> 7) << 0xf
        ;
        uVar28 = (uint)uVar20;
        while (uVar20 != 0) {
          uVar5 = 0;
          if (uVar28 != 0) {
            for (; (uVar28 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
            }
          }
          lVar26 = *(long *)(this + 0x18);
          raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
          ::slot_array(*(raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                         **)this);
          i = uVar5 + uVar25 & (ulong)prVar3;
          __n = key->_M_string_length;
          puVar4 = *(undefined8 **)(*(long *)(lVar26 + i * 8) + 8);
          if ((puVar4[1] == __n) &&
             ((__n == 0 ||
              (iVar21 = bcmp((void *)*puVar4,(key->_M_dataplus)._M_p,__n), __n = extraout_RDX_04,
              iVar21 == 0)))) {
            iVar35 = raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     ::iterator_at((raw_hash_set<absl::lts_20240722::container_internal::FlatHashSetPolicy<const_google::protobuf::Descriptor_*>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>,_google::protobuf::(anonymous_namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>,_std::allocator<const_google::protobuf::Descriptor_*>_>
                                    *)this,i);
            return iVar35;
          }
          uVar20 = (ushort)(uVar28 - 1) & (ushort)uVar28;
          uVar28 = CONCAT22((short)(uVar28 - 1 >> 0x10),uVar20);
        }
        local_a8 = (char)uVar18;
        cStack_a7 = (char)((ulong)uVar18 >> 8);
        cStack_a6 = (char)((ulong)uVar18 >> 0x10);
        cStack_a5 = (char)((ulong)uVar18 >> 0x18);
        cStack_a4 = (char)((ulong)uVar18 >> 0x20);
        cStack_a3 = (char)((ulong)uVar18 >> 0x28);
        cStack_a2 = (char)((ulong)uVar18 >> 0x30);
        cStack_a1 = (char)((ulong)uVar18 >> 0x38);
        auVar34[0] = -(local_a8 == -0x80);
        auVar34[1] = -(cStack_a7 == -0x80);
        auVar34[2] = -(cStack_a6 == -0x80);
        auVar34[3] = -(cStack_a5 == -0x80);
        auVar34[4] = -(cStack_a4 == -0x80);
        auVar34[5] = -(cStack_a3 == -0x80);
        auVar34[6] = -(cStack_a2 == -0x80);
        auVar34[7] = -(cStack_a1 == -0x80);
        auVar34[8] = -(cVar10 == -0x80);
        auVar34[9] = -(cVar11 == -0x80);
        auVar34[10] = -(cVar12 == -0x80);
        auVar34[0xb] = -(cVar13 == -0x80);
        auVar34[0xc] = -(cVar14 == -0x80);
        auVar34[0xd] = -(cVar15 == -0x80);
        auVar34[0xe] = -(cVar16 == -0x80);
        auVar34[0xf] = -(cVar17 == -0x80);
        if ((((((((((((((((auVar34 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar34 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar34 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar34 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar34 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar34 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar34 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar34 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar34 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar34 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar34 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar34 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar34 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar34 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar34 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar17 == -0x80)
        {
          auVar9._8_8_ = 0;
          auVar9._0_8_ = __n;
          return (iterator)(auVar9 << 0x40);
        }
        if (*(ulong *)this == 0) break;
        uVar25 = uVar25 + uVar31 + 0x10;
        uVar31 = uVar31 + 0x10;
        if (*(ulong *)this < uVar31) {
          __assert_fail("seq.index() <= capacity() && \"full table!\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                        ,0xdbd,
                        "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, std::allocator<const google::protobuf::Descriptor *>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, Alloc = std::allocator<const google::protobuf::Descriptor *>, K = std::basic_string<char>]"
                       );
        }
      }
    }
  }
LAB_001fadcd:
  __assert_fail("!kEnabled || cap >= kCapacity",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0xb37,
                "size_t absl::container_internal::raw_hash_set<absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, std::allocator<const google::protobuf::Descriptor *>>::capacity() const [Policy = absl::container_internal::FlatHashSetPolicy<const google::protobuf::Descriptor *>, Hash = google::protobuf::(anonymous namespace)::DescriptorsByNameHash<google::protobuf::Descriptor>, Eq = google::protobuf::(anonymous namespace)::DescriptorsByNameEq<google::protobuf::Descriptor>, Alloc = std::allocator<const google::protobuf::Descriptor *>]"
               );
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertHashEqConsistent(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }